

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

void Curl_setup_transfer(connectdata *conn,int sockindex,curl_off_t size,_Bool getheader,
                        curl_off_t *bytecountp,int writesockindex,curl_off_t *writecountp)

{
  Curl_easy *data_00;
  curltime cVar1;
  curl_socket_t local_70;
  curl_socket_t local_6c;
  curl_socket_t local_68;
  curl_socket_t local_64;
  undefined4 uStack_54;
  HTTP *http;
  SingleRequest *k;
  Curl_easy *data;
  int writesockindex_local;
  curl_off_t *bytecountp_local;
  _Bool getheader_local;
  curl_off_t size_local;
  int sockindex_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  if ((((conn->bits).multiplex & 1U) == 0) && (conn->httpversion != 0x14)) {
    if (sockindex == -1) {
      local_6c = -1;
    }
    else {
      local_6c = conn->sock[sockindex];
    }
    conn->sockfd = local_6c;
    if (writesockindex == -1) {
      local_70 = -1;
    }
    else {
      local_70 = conn->sock[writesockindex];
    }
    conn->writesockfd = local_70;
  }
  else {
    if (sockindex == -1) {
      if (writesockindex == -1) {
        local_64 = -1;
      }
      else {
        local_64 = conn->sock[writesockindex];
      }
      local_68 = local_64;
    }
    else {
      local_68 = conn->sock[sockindex];
    }
    conn->sockfd = local_68;
    conn->writesockfd = conn->sockfd;
  }
  (data_00->req).getheader = getheader;
  (data_00->req).size = size;
  (data_00->req).bytecountp = bytecountp;
  (data_00->req).writebytecountp = writecountp;
  if ((((data_00->req).getheader & 1U) == 0) && ((data_00->req).header = false, 0 < size)) {
    Curl_pgrsSetDownloadSize(data_00,size);
  }
  if ((((data_00->req).getheader & 1U) != 0) || (((data_00->set).opt_no_body & 1U) == 0)) {
    if (sockindex != -1) {
      (data_00->req).keepon = (data_00->req).keepon | 1;
    }
    if (writesockindex != -1) {
      if (((((data_00->state).expect100header & 1U) == 0) || ((conn->handler->protocol & 3) == 0))
         || (*(int *)((long)(data_00->req).protop + 0x218) != 2)) {
        if (((data_00->state).expect100header & 1U) != 0) {
          (data_00->req).exp100 = EXP100_SENDING_REQUEST;
        }
        (data_00->req).keepon = (data_00->req).keepon | 2;
      }
      else {
        (data_00->req).exp100 = EXP100_AWAITING_CONTINUE;
        cVar1 = Curl_now();
        (data_00->req).start100.tv_sec = cVar1.tv_sec;
        *(ulong *)&(data_00->req).start100.tv_usec = CONCAT44(uStack_54,cVar1.tv_usec);
        Curl_expire(data_00,(data_00->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
      }
    }
  }
  return;
}

Assistant:

void
Curl_setup_transfer(
  struct connectdata *conn, /* connection data */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  curl_off_t *bytecountp,   /* return number of bytes read or NULL */
  int writesockindex,       /* socket index to write to, it may very well be
                               the same we read from. -1 disables */
  curl_off_t *writecountp   /* return number of bytes written or NULL */
  )
{
  struct Curl_easy *data;
  struct SingleRequest *k;

  DEBUGASSERT(conn != NULL);

  data = conn->data;
  k = &data->req;

  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));

  if(conn->bits.multiplex || conn->httpversion == 20) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD:conn->sock[writesockindex];
  }
  k->getheader = getheader;

  k->size = size;
  k->bytecountp = bytecountp;
  k->writebytecountp = writecountp;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then don't do this! */
  if(k->getheader || !data->set.opt_no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1) {
      struct HTTP *http = data->req.protop;
      /* HTTP 1.1 magic:

         Even if we require a 100-return code before uploading data, we might
         need to write data before that since the REQUEST may not have been
         finished sent off just yet.

         Thus, we must check if the request has been sent before we set the
         state info where we wait for the 100-return code
      */
      if((data->state.expect100header) &&
         (conn->handler->protocol&PROTO_FAMILY_HTTP) &&
         (http->sending == HTTPSEND_BODY)) {
        /* wait with write until we either got 100-continue or a timeout */
        k->exp100 = EXP100_AWAITING_CONTINUE;
        k->start100 = Curl_now();

        /* Set a timeout for the multi interface. Add the inaccuracy margin so
           that we don't fire slightly too early and get denied to run. */
        Curl_expire(data, data->set.expect_100_timeout, EXPIRE_100_TIMEOUT);
      }
      else {
        if(data->state.expect100header)
          /* when we've sent off the rest of the headers, we must await a
             100-continue but first finish sending the request */
          k->exp100 = EXP100_SENDING_REQUEST;

        /* enable the write bit when we're not waiting for continue */
        k->keepon |= KEEP_SEND;
      }
    } /* if(writesockindex != -1) */
  } /* if(k->getheader || !data->set.opt_no_body) */

}